

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

void skipdata_opstr(char *opstr,uint8_t *buffer,size_t size)

{
  int iVar1;
  size_t local_40;
  size_t available;
  size_t i;
  char *pcStack_28;
  int len;
  char *p;
  size_t size_local;
  uint8_t *buffer_local;
  char *opstr_local;
  
  if (size == 0) {
    *opstr = '\0';
  }
  else {
    iVar1 = cs_snprintf(opstr,0xa0,"0x%02x",(ulong)*buffer);
    pcStack_28 = opstr + iVar1;
    available = 1;
    for (local_40 = 0xa0 - (long)iVar1;
        ((available < size &&
         (iVar1 = cs_snprintf(pcStack_28,local_40,", 0x%02x",(ulong)buffer[available]), -1 < iVar1))
        && ((ulong)(long)iVar1 <= local_40 - 1)); local_40 = local_40 - (long)iVar1) {
      pcStack_28 = pcStack_28 + iVar1;
      available = available + 1;
    }
  }
  return;
}

Assistant:

static void skipdata_opstr(char *opstr, const uint8_t *buffer, size_t size)
{
	char *p = opstr;
	int len;
	size_t i;
	size_t available = sizeof(((cs_insn*)NULL)->op_str);

	if (!size) {
		opstr[0] = '\0';
		return;
	}

	len = cs_snprintf(p, available, "0x%02x", buffer[0]);
	p+= len;
	available -= len;

	for(i = 1; i < size; i++) {
		len = cs_snprintf(p, available, ", 0x%02x", buffer[i]);
		if (len < 0) {
			break;
		}
		if ((size_t)len > available - 1) {
			break;
		}
		p+= len;
		available -= len;
	}
}